

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O2

strbuf * strbuf_new_general(_Bool nm)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  
  puVar1 = (undefined8 *)safemalloc(1,0x40,0);
  puVar1[4] = strbuf_BinarySink_write;
  puVar1[6] = puVar1 + 4;
  puVar1[5] = strbuf_BinarySink_writefmtv;
  puVar1[3] = 0;
  *puVar1 = 0x200;
  *(_Bool *)(puVar1 + 7) = nm;
  puVar2 = (undefined1 *)safemalloc(0x200,1,0);
  puVar1[1] = puVar2;
  puVar1[2] = puVar2;
  *puVar2 = 0;
  return (strbuf *)(puVar1 + 1);
}

Assistant:

static strbuf *strbuf_new_general(bool nm)
{
    struct strbuf_impl *buf = snew(struct strbuf_impl);
    BinarySink_INIT(&buf->visible, strbuf_BinarySink_write);
    buf->visible.binarysink_->writefmtv = strbuf_BinarySink_writefmtv;
    buf->visible.len = 0;
    buf->size = 512;
    buf->nm = nm;
    STRBUF_SET_PTR(buf, snewn(buf->size, char));
    *buf->visible.s = '\0';
    return &buf->visible;
}